

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

int __thiscall diy::FileStorage::put(FileStorage *this,void *x,Save *save)

{
  size_t sz;
  int iVar1;
  string filename;
  FileBuffer fb;
  void *local_70;
  string local_68;
  BinaryBuffer local_48;
  FILE *local_40;
  size_t local_38;
  undefined8 uStack_30;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  iVar1 = open_random(this,&local_68);
  local_40 = fdopen(iVar1,"w");
  local_48._vptr_BinaryBuffer = (_func_int **)&PTR__BinaryBuffer_00150080;
  local_38 = 0;
  uStack_30 = 0;
  local_70 = x;
  if ((save->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*save->_M_invoker)((_Any_data *)save,&local_70,&local_48);
    sz = local_38;
    fclose(local_40);
    fsync(iVar1);
    iVar1 = make_file_record(this,&local_68,sz);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual int    put(const void* x, detail::Save save) override
      {
        std::string     filename;
        int fh = open_random(filename);
#if defined(_WIN32)
        detail::FileBuffer fb(_fdopen(fh, "wb"));
#else
        detail::FileBuffer fb(fdopen(fh, "w"));
#endif
        save(x, fb);
        size_t sz = fb.size();
        fclose(fb.file);
        io::utils::sync(fh);

        return make_file_record(filename, sz);
      }